

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astMessageChainNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_astMessageChainNode_t *psVar1;
  _Bool _Var2;
  sysbvm_tuple_t *psVar3;
  sysbvm_tuple_t sVar4;
  size_t slotCount;
  sysbvm_tuple_t sVar5;
  sysbvm_tuple_t sVar6;
  sysbvm_tuple_t sVar7;
  size_t local_120;
  size_t i;
  sysbvm_astVariableDefinitionNode_t *receiverLocalDefinition;
  sysbvm_astTupleWithLookupStartingFromNode_t *objectLookup;
  size_t chainedMessageCount;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_136_17_406216ad gcFrame;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar3 = arguments + 1;
  memset(&gcFrameRecord.roots,0,0x88);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = 0x11;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_context_shallowCopy(context,*arguments);
  sVar4 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,*psVar3);
  gcFrameRecord.roots[3] = sVar4;
  chainedMessageCount = 0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = gcFrameRecord.roots[2];
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&chainedMessageCount);
  slotCount = sysbvm_array_getSize(gcFrameRecord.roots[7]);
  if (gcFrameRecord.roots[5] != 0) {
    gcFrame.chainNode =
         (sysbvm_astMessageChainNode_t *)
         sysbvm_interpreter_analyzeASTWithDirectTypeWithEnvironment
                   (context,gcFrameRecord.roots[5],*psVar3);
    gcFrameRecord.roots[5] = (sysbvm_tuple_t)gcFrame.chainNode;
    _Var2 = sysbvm_astNode_isTupleWithLookupStartingFromNode
                      (context,(sysbvm_tuple_t)gcFrame.chainNode);
    if (_Var2) {
      psVar1 = (sysbvm_astMessageChainNode_t *)(gcFrame.chainNode)->receiver;
      gcFrameRecord.roots[5] = (sysbvm_tuple_t)psVar1;
      gcFrame.analyzedReceiver = (gcFrame.chainNode)->receiverLookupType;
      gcFrameRecord.roots[6] = gcFrame.analyzedReceiver;
      gcFrame.chainNode = psVar1;
    }
    sVar4 = sysbvm_astNode_getAnalyzedType((sysbvm_tuple_t)gcFrame.chainNode);
    if ((sVar4 != 0) &&
       (_Var2 = sysbvm_astNode_isLiteralNode(context,gcFrameRecord.roots[5]), _Var2)) {
      sVar5 = sysbvm_tuple_getType(context,sVar4);
      sVar5 = sysbvm_type_getAnalyzeMessageChainNodeWithEnvironmentFunction(context,sVar5);
      if (sVar5 != 0) {
        sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&chainedMessageCount);
        sysbvm_stackFrame_popRecord
                  ((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
        sVar4 = sysbvm_function_apply3
                          (context,sVar5,sVar4,(sysbvm_tuple_t)gcFrameRecord.roots,*psVar3);
        return sVar4;
      }
    }
    if (slotCount == 0) {
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&chainedMessageCount);
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition)
      ;
      return (sysbvm_tuple_t)gcFrame.chainNode;
    }
    if (slotCount == 1) {
      sVar4 = sysbvm_array_at(gcFrameRecord.roots[7],0);
      sysbvm_astMessageChainMessageNode_expandToMessageWithReceiver
                (context,sVar4,(sysbvm_tuple_t)gcFrame.chainNode,gcFrame.analyzedReceiver);
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&chainedMessageCount);
      sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition)
      ;
      sVar4 = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment
                        (context,(sysbvm_tuple_t)gcFrame.chainNode,*psVar3);
      return sVar4;
    }
    _Var2 = sysbvm_astNode_isLiteralNode(context,(sysbvm_tuple_t)gcFrame.chainNode);
    if (_Var2) {
      gcFrame.expansionReceiverSymbol = (sysbvm_tuple_t)gcFrame.chainNode;
      gcFrame.expansionReceiverExpression = (sysbvm_tuple_t)gcFrame.chainNode;
    }
    else {
      sVar5 = sysbvm_astNode_getSourcePosition((sysbvm_tuple_t)gcFrame.chainNode);
      sVar6 = sysbvm_symbol_internWithCString(context,"<messageChainReceiver>");
      sVar6 = sysbvm_generatedSymbol_create(context,sVar6,sVar5);
      sVar7 = sysbvm_astLiteralNode_create(context,sVar5,sVar6);
      gcFrame.expansionReceiverSymbol =
           sysbvm_astVariableDefinitionNode_create
                     (context,sVar5,sVar7,0,(sysbvm_tuple_t)gcFrame.chainNode,false);
      *(sysbvm_tuple_t *)(gcFrame.expansionReceiverSymbol + 0x20) = sVar4;
      sVar7 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,*psVar3);
      *(sysbvm_tuple_t *)(gcFrame.expansionReceiverSymbol + 0x18) = sVar7;
      sVar4 = sysbvm_analysisEnvironment_setNewSymbolLocalBinding(context,*psVar3,sVar5,sVar6,sVar4)
      ;
      *(sysbvm_tuple_t *)(gcFrame.expansionReceiverSymbol + 0x40) = sVar4;
      gcFrame.expansionReceiverExpression =
           sysbvm_astIdentifierReferenceNode_create(context,sVar5,sVar6);
    }
  }
  sVar4 = sysbvm_array_create(context,slotCount);
  gcFrameRecord.roots[4] = 0;
  for (local_120 = 0; local_120 < slotCount; local_120 = local_120 + 1) {
    sVar5 = sysbvm_array_at(gcFrameRecord.roots[7],local_120);
    sVar5 = sysbvm_astMessageChainMessageNode_expandToMessageWithReceiver
                      (context,sVar5,gcFrame.expansionReceiverExpression,gcFrame.analyzedReceiver);
    sysbvm_array_atPut(sVar4,local_120,sVar5);
  }
  sVar5 = gcFrameRecord.roots[2];
  sVar6 = sysbvm_array_create(context,0);
  sVar4 = sysbvm_astSequenceNode_create(context,sVar5,sVar6,sVar4);
  sVar4 = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context,sVar4,*psVar3)
  ;
  gcFrame.analyzedExpandedChainedMessages = sVar4;
  if (gcFrame.expansionReceiverSymbol != gcFrame.expansionReceiverExpression) {
    sVar6 = sysbvm_array_create(context,2);
    sysbvm_array_atPut(sVar6,0,gcFrame.expansionReceiverSymbol);
    sysbvm_array_atPut(sVar6,1,sVar4);
    sVar5 = gcFrameRecord.roots[2];
    sVar7 = sysbvm_array_create(context,0);
    gcFrame.analyzedExpandedChainedMessages =
         sysbvm_astSequenceNode_create(context,sVar5,sVar7,sVar6);
    sVar4 = sysbvm_astNode_getAnalyzedType(sVar4);
    *(sysbvm_tuple_t *)(gcFrame.analyzedExpandedChainedMessages + 0x20) = sVar4;
    sVar4 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,*psVar3);
    *(sysbvm_tuple_t *)(gcFrame.analyzedExpandedChainedMessages + 0x18) = sVar4;
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&chainedMessageCount);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  return gcFrame.analyzedExpandedChainedMessages;
}

Assistant:

static sysbvm_tuple_t sysbvm_astMessageChainNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astMessageChainNode_t *chainNode;
        sysbvm_tuple_t analyzedReceiver;
        sysbvm_tuple_t analyzedReceiverTypeExpression;
        sysbvm_tuple_t expandedChainedMessages;
        sysbvm_tuple_t expandedChainedMessageNode;
        sysbvm_tuple_t chainedMessageNode;

        sysbvm_tuple_t receiverType;
        sysbvm_tuple_t receiverMetaType;
        sysbvm_tuple_t analysisFunction;

        sysbvm_tuple_t receiverSourcePosition;
        sysbvm_tuple_t expansionReceiverSymbol;
        sysbvm_tuple_t expansionReceiverExpression;
        sysbvm_tuple_t expansionReceiverIdentifier;
        sysbvm_tuple_t expansionMessageSequence;
        sysbvm_tuple_t expansionLocalAndMessageSequenceArray;

        sysbvm_tuple_t analyzedExpandedChainedMessages;
        sysbvm_tuple_t analyzedExpansion;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    
    gcFrame.chainNode = (sysbvm_astMessageChainNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.chainNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.chainNode->super.sourcePosition);

    size_t chainedMessageCount = sysbvm_array_getSize(gcFrame.chainNode->messages);

    if(gcFrame.chainNode->receiver)
    {
        gcFrame.analyzedReceiver = sysbvm_interpreter_analyzeASTWithDirectTypeWithEnvironment(context, gcFrame.chainNode->receiver, *environment);
        gcFrame.chainNode->receiver = gcFrame.analyzedReceiver;

        // Inline the object with lookup starting from node.
        if(sysbvm_astNode_isTupleWithLookupStartingFromNode(context, gcFrame.analyzedReceiver))
        {
            sysbvm_astTupleWithLookupStartingFromNode_t *objectLookup = (sysbvm_astTupleWithLookupStartingFromNode_t*)gcFrame.analyzedReceiver;
            gcFrame.analyzedReceiver = objectLookup->tupleExpression;
            gcFrame.chainNode->receiver = gcFrame.analyzedReceiver;
            
            gcFrame.analyzedReceiverTypeExpression = objectLookup->typeExpression;
            gcFrame.chainNode->receiverLookupType = gcFrame.analyzedReceiverTypeExpression;
        }

        gcFrame.receiverType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedReceiver);
        // HACK: remove this literal check when properly implementing this analysis in the target system.
        if(gcFrame.receiverType && sysbvm_astNode_isLiteralNode(context, gcFrame.chainNode->receiver))
        {
            gcFrame.receiverMetaType = sysbvm_tuple_getType(context, gcFrame.receiverType);
            gcFrame.analysisFunction = sysbvm_type_getAnalyzeMessageChainNodeWithEnvironmentFunction(context, gcFrame.receiverMetaType);
            if(gcFrame.analysisFunction)
            {
                SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
                SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
                return sysbvm_function_apply3(context, gcFrame.analysisFunction, gcFrame.receiverType, (sysbvm_tuple_t)gcFrame.chainNode, *environment);
            }
        }

        // Simple cases.
        if(chainedMessageCount == 0)
        {
            SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            return gcFrame.analyzedReceiver;
        }
        else if(chainedMessageCount == 1)
        {
            gcFrame.chainedMessageNode = sysbvm_array_at(gcFrame.chainNode->messages, 0);
            gcFrame.expansionMessageSequence = sysbvm_astMessageChainMessageNode_expandToMessageWithReceiver(context, gcFrame.chainedMessageNode, gcFrame.analyzedReceiver, gcFrame.analyzedReceiverTypeExpression);
            SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
            SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
            return sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.analyzedReceiver, *environment);
        }

        // Do we need to define a variable for the receiver?
        if(sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedReceiver))
        {
            gcFrame.expansionReceiverExpression = gcFrame.analyzedReceiver;
            gcFrame.expansionReceiverIdentifier = gcFrame.analyzedReceiver;
        }
        else
        {
            gcFrame.receiverSourcePosition = sysbvm_astNode_getSourcePosition(gcFrame.analyzedReceiver);
            gcFrame.expansionReceiverSymbol = sysbvm_generatedSymbol_create(context, sysbvm_symbol_internWithCString(context, "<messageChainReceiver>"), gcFrame.receiverSourcePosition);

            gcFrame.expansionReceiverExpression = sysbvm_astVariableDefinitionNode_create(context, gcFrame.receiverSourcePosition, sysbvm_astLiteralNode_create(context, gcFrame.receiverSourcePosition, gcFrame.expansionReceiverSymbol), SYSBVM_NULL_TUPLE, gcFrame.analyzedReceiver, false);
            sysbvm_astVariableDefinitionNode_t *receiverLocalDefinition = (sysbvm_astVariableDefinitionNode_t *)gcFrame.expansionReceiverExpression;
            receiverLocalDefinition->super.analyzedType = gcFrame.receiverType;
            receiverLocalDefinition->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
            receiverLocalDefinition->binding = sysbvm_analysisEnvironment_setNewSymbolLocalBinding(context, *environment, gcFrame.receiverSourcePosition, gcFrame.expansionReceiverSymbol, gcFrame.receiverType);

            gcFrame.expansionReceiverIdentifier = sysbvm_astIdentifierReferenceNode_create(context, gcFrame.receiverSourcePosition, gcFrame.expansionReceiverSymbol);
        }
    }

    // Message sequence.
    gcFrame.expandedChainedMessages = sysbvm_array_create(context, chainedMessageCount);
    gcFrame.chainNode->super.analyzedType = SYSBVM_NULL_TUPLE;
    for(size_t i = 0; i < chainedMessageCount; ++i)
    {
        gcFrame.chainedMessageNode = sysbvm_array_at(gcFrame.chainNode->messages, i);
        gcFrame.expandedChainedMessageNode = sysbvm_astMessageChainMessageNode_expandToMessageWithReceiver(context, gcFrame.chainedMessageNode, gcFrame.expansionReceiverIdentifier, gcFrame.analyzedReceiverTypeExpression);
        sysbvm_array_atPut(gcFrame.expandedChainedMessages, i, gcFrame.expandedChainedMessageNode);
    }
    gcFrame.expansionMessageSequence = sysbvm_astSequenceNode_create(context, gcFrame.chainNode->super.sourcePosition, sysbvm_array_create(context, 0), gcFrame.expandedChainedMessages);
    gcFrame.analyzedExpandedChainedMessages = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.expansionMessageSequence, *environment);

    // Local definition and message sequence.
    gcFrame.analyzedExpansion = gcFrame.analyzedExpandedChainedMessages;
    if(gcFrame.expansionReceiverExpression != gcFrame.expansionReceiverIdentifier)
    {
        gcFrame.expansionLocalAndMessageSequenceArray = sysbvm_array_create(context, 2);
        sysbvm_array_atPut(gcFrame.expansionLocalAndMessageSequenceArray, 0, gcFrame.expansionReceiverExpression);
        sysbvm_array_atPut(gcFrame.expansionLocalAndMessageSequenceArray, 1, gcFrame.analyzedExpandedChainedMessages);

        gcFrame.analyzedExpansion = sysbvm_astSequenceNode_create(context, gcFrame.chainNode->super.sourcePosition, sysbvm_array_create(context, 0), gcFrame.expansionLocalAndMessageSequenceArray);
        ((sysbvm_astNode_t*)gcFrame.analyzedExpansion)->analyzedType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedExpandedChainedMessages);
        ((sysbvm_astNode_t*)gcFrame.analyzedExpansion)->analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
    }
    
    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.analyzedExpansion;
}